

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_atan_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ushort uVar6;
  uint64_t uVar7;
  undefined4 uVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 a_31;
  floatx80 a_32;
  floatx80 a_33;
  floatx80 a_34;
  floatx80 a_35;
  floatx80 a_36;
  floatx80 a_37;
  floatx80 a_38;
  floatx80 a_39;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  floatx80 b_34;
  floatx80 b_35;
  floatx80 b_36;
  floatx80 b_37;
  floatx80 b_38;
  floatx80 b_39;
  floatx80 b_40;
  
  uVar9 = a.low;
  uVar12 = a._8_4_;
  uVar11 = (ulong)uVar12;
  auVar3 = a._0_12_;
  if ((~uVar12 & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      float_raise_m68k(' ',status);
      fVar15._8_4_ = uVar12 & 0xffffbfff;
      fVar15.low = 0xc90fdaa22168c235;
      fVar15._12_4_ = 0;
      fVar13 = floatx80_move_m68k(fVar15,status);
      return fVar13;
    }
    fVar13._12_4_ = 0;
    fVar13.low = auVar3._0_8_;
    fVar13.high = auVar3._8_2_;
    fVar13._10_2_ = auVar3._10_2_;
    fVar13 = propagateFloatx80NaNOneArg(fVar13,status);
    return fVar13;
  }
  if (uVar9 == 0 && ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    uVar9 = 0;
    goto LAB_006721ea;
  }
  uVar10 = (uVar12 & 0x7fff) * 0x10000;
  cVar1 = status->float_rounding_mode;
  cVar2 = status->floatx80_rounding_precision;
  status->float_rounding_mode = '\0';
  status->floatx80_rounding_precision = 'P';
  uVar6 = a.low._6_2_;
  if (uVar10 + uVar6 + 0xbffd0000 < 0xfff88000) {
    uVar10 = uVar10 | uVar6;
    if (uVar10 < 0x3fff8001) {
      if (0x3fd77fff < uVar10) {
        a_26._12_4_ = 0;
        a_26.low = auVar3._0_8_;
        a_26.high = auVar3._8_2_;
        a_26._10_2_ = auVar3._10_2_;
        b_27._12_4_ = 0;
        b_27.low = auVar3._0_8_;
        b_27.high = auVar3._8_2_;
        b_27._10_2_ = auVar3._10_2_;
        fVar13 = floatx80_mul_m68k(a_26,b_27,status);
        b_28._8_8_ = fVar13._8_8_ & 0xffffffff;
        a_27._8_8_ = fVar13._8_8_ & 0xffffffff;
        a_27.low = fVar13.low;
        b_28.low = fVar13.low;
        fVar15 = floatx80_mul_m68k(a_27,b_28,status);
        fVar16 = float64_to_floatx80_m68k(0x3fb344447f876989,status);
        fVar17 = float64_to_floatx80_m68k(0xbfb744ee7faf45db,status);
        auVar4 = fVar16._0_12_;
        a_28._12_4_ = 0;
        a_28.low = auVar4._0_8_;
        a_28.high = auVar4._8_2_;
        a_28._10_2_ = auVar4._10_2_;
        auVar4 = fVar15._0_12_;
        b_29._12_4_ = 0;
        b_29.low = auVar4._0_8_;
        b_29.high = auVar4._8_2_;
        b_29._10_2_ = auVar4._10_2_;
        fVar15 = floatx80_mul_m68k(a_28,b_29,status);
        auVar5 = fVar17._0_12_;
        a_29._12_4_ = 0;
        a_29.low = auVar5._0_8_;
        a_29.high = auVar5._8_2_;
        a_29._10_2_ = auVar5._10_2_;
        b_30._12_4_ = 0;
        b_30.low = auVar4._0_8_;
        b_30.high = auVar4._8_2_;
        b_30._10_2_ = auVar4._10_2_;
        fVar16 = floatx80_mul_m68k(a_29,b_30,status);
        fVar17 = float64_to_floatx80_m68k(0x3fbc71c646940220,status);
        b_31._8_8_ = fVar17._8_8_ & 0xffffffff;
        auVar5 = fVar15._0_12_;
        a_30._12_4_ = 0;
        a_30.low = auVar5._0_8_;
        a_30.high = auVar5._8_2_;
        a_30._10_2_ = auVar5._10_2_;
        b_31.low = fVar17.low;
        fVar15 = floatx80_add_m68k(a_30,b_31,status);
        fVar17 = float64_to_floatx80_m68k(0xbfc24924921872f9,status);
        b_32._8_8_ = fVar17._8_8_ & 0xffffffff;
        auVar5 = fVar16._0_12_;
        a_31._12_4_ = 0;
        a_31.low = auVar5._0_8_;
        a_31.high = auVar5._8_2_;
        a_31._10_2_ = auVar5._10_2_;
        b_32.low = fVar17.low;
        fVar16 = floatx80_add_m68k(a_31,b_32,status);
        auVar5 = fVar15._0_12_;
        a_32._12_4_ = 0;
        a_32.low = auVar5._0_8_;
        a_32.high = auVar5._8_2_;
        a_32._10_2_ = auVar5._10_2_;
        b_33._12_4_ = 0;
        b_33.low = auVar4._0_8_;
        b_33.high = auVar4._8_2_;
        b_33._10_2_ = auVar4._10_2_;
        fVar15 = floatx80_mul_m68k(a_32,b_33,status);
        a_33._12_4_ = 0;
        a_33.low = auVar4._0_8_;
        a_33.high = auVar4._8_2_;
        a_33._10_2_ = auVar4._10_2_;
        auVar4 = fVar16._0_12_;
        b_34._12_4_ = 0;
        b_34.low = auVar4._0_8_;
        b_34.high = auVar4._8_2_;
        b_34._10_2_ = auVar4._10_2_;
        fVar16 = floatx80_mul_m68k(a_33,b_34,status);
        fVar17 = float64_to_floatx80_m68k(0x3fc9999999998fa9,status);
        b_35._8_8_ = fVar17._8_8_ & 0xffffffff;
        auVar4 = fVar15._0_12_;
        a_34._12_4_ = 0;
        a_34.low = auVar4._0_8_;
        a_34.high = auVar4._8_2_;
        a_34._10_2_ = auVar4._10_2_;
        b_35.low = fVar17.low;
        fVar15 = floatx80_add_m68k(a_34,b_35,status);
        fVar17 = float64_to_floatx80_m68k(0xbfd5555555555555,status);
        b_36._8_8_ = fVar17._8_8_ & 0xffffffff;
        auVar4 = fVar16._0_12_;
        a_35._12_4_ = 0;
        a_35.low = auVar4._0_8_;
        a_35.high = auVar4._8_2_;
        a_35._10_2_ = auVar4._10_2_;
        b_36.low = fVar17.low;
        fVar16 = floatx80_add_m68k(a_35,b_36,status);
        auVar5 = fVar13._0_12_;
        auVar4 = fVar15._0_12_;
        a_36._12_4_ = 0;
        a_36.low = auVar4._0_8_;
        a_36.high = auVar4._8_2_;
        a_36._10_2_ = auVar4._10_2_;
        b_37._12_4_ = 0;
        b_37.low = auVar5._0_8_;
        b_37.high = auVar5._8_2_;
        b_37._10_2_ = auVar5._10_2_;
        fVar13 = floatx80_mul_m68k(a_36,b_37,status);
        a_37._12_4_ = 0;
        a_37.low = auVar5._0_8_;
        a_37.high = auVar5._8_2_;
        a_37._10_2_ = auVar5._10_2_;
        b_38._12_4_ = 0;
        b_38.low = auVar3._0_8_;
        b_38.high = auVar3._8_2_;
        b_38._10_2_ = auVar3._10_2_;
        fVar15 = floatx80_mul_m68k(a_37,b_38,status);
        auVar3 = fVar16._0_12_;
        a_38._12_4_ = 0;
        a_38.low = auVar3._0_8_;
        a_38.high = auVar3._8_2_;
        a_38._10_2_ = auVar3._10_2_;
        auVar3 = fVar13._0_12_;
        b_39._12_4_ = 0;
        b_39.low = auVar3._0_8_;
        b_39.high = auVar3._8_2_;
        b_39._10_2_ = auVar3._10_2_;
        fVar13 = floatx80_add_m68k(a_38,b_39,status);
        b_40._8_8_ = fVar13._8_8_ & 0xffffffff;
        auVar3 = fVar15._0_12_;
        a_39._12_4_ = 0;
        a_39.low = auVar3._0_8_;
        a_39.high = auVar3._8_2_;
        a_39._10_2_ = auVar3._10_2_;
        b_40.low = fVar13.low;
        fVar13 = floatx80_mul_m68k(a_39,b_40,status);
        uVar7 = fVar13.low;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        uVar8 = fVar13._8_4_;
        goto LAB_006721cd;
      }
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      a_11._12_4_ = 0;
      a_11.low = auVar3._0_8_;
      a_11.high = auVar3._8_2_;
      a_11._10_2_ = auVar3._10_2_;
      fVar13 = floatx80_move_m68k(a_11,status);
      auVar3 = fVar13._0_12_;
    }
    else {
      if (uVar10 < 0x40638001) {
        a_12._8_8_ = 0xbfff;
        a_12.low = 0x8000000000000000;
        b_13._12_4_ = 0;
        b_13.low = auVar3._0_8_;
        b_13.high = auVar3._8_2_;
        b_13._10_2_ = auVar3._10_2_;
        fVar13 = floatx80_div_m68k(a_12,b_13,status);
        b_14._8_8_ = fVar13._8_8_ & 0xffffffff;
        a_13._8_8_ = fVar13._8_8_ & 0xffffffff;
        a_13.low = fVar13.low;
        b_14.low = fVar13.low;
        fVar15 = floatx80_mul_m68k(a_13,b_14,status);
        b_15._8_8_ = fVar15._8_8_ & 0xffffffff;
        a_14._8_8_ = fVar15._8_8_ & 0xffffffff;
        a_14.low = fVar15.low;
        b_15.low = fVar15.low;
        fVar16 = floatx80_mul_m68k(a_14,b_15,status);
        fVar17 = float64_to_floatx80_m68k(0xbfb70bf398539e6a,status);
        fVar18 = float64_to_floatx80_m68k(0x3fbc7187962d1d7d,status);
        auVar3 = fVar17._0_12_;
        a_15._12_4_ = 0;
        a_15.low = auVar3._0_8_;
        a_15.high = auVar3._8_2_;
        a_15._10_2_ = auVar3._10_2_;
        auVar3 = fVar16._0_12_;
        b_16._12_4_ = 0;
        b_16.low = auVar3._0_8_;
        b_16.high = auVar3._8_2_;
        b_16._10_2_ = auVar3._10_2_;
        fVar16 = floatx80_mul_m68k(a_15,b_16,status);
        auVar4 = fVar18._0_12_;
        a_16._12_4_ = 0;
        a_16.low = auVar4._0_8_;
        a_16.high = auVar4._8_2_;
        a_16._10_2_ = auVar4._10_2_;
        b_17._12_4_ = 0;
        b_17.low = auVar3._0_8_;
        b_17.high = auVar3._8_2_;
        b_17._10_2_ = auVar3._10_2_;
        fVar17 = floatx80_mul_m68k(a_16,b_17,status);
        fVar18 = float64_to_floatx80_m68k(0xbfc24924827107b8,status);
        b_18._8_8_ = fVar18._8_8_ & 0xffffffff;
        auVar4 = fVar16._0_12_;
        a_17._12_4_ = 0;
        a_17.low = auVar4._0_8_;
        a_17.high = auVar4._8_2_;
        a_17._10_2_ = auVar4._10_2_;
        b_18.low = fVar18.low;
        fVar16 = floatx80_add_m68k(a_17,b_18,status);
        fVar18 = float64_to_floatx80_m68k(0x3fc999999996263e,status);
        b_19._8_8_ = fVar18._8_8_ & 0xffffffff;
        auVar4 = fVar17._0_12_;
        a_18._12_4_ = 0;
        a_18.low = auVar4._0_8_;
        a_18.high = auVar4._8_2_;
        a_18._10_2_ = auVar4._10_2_;
        b_19.low = fVar18.low;
        fVar17 = floatx80_add_m68k(a_18,b_19,status);
        a_19._12_4_ = 0;
        a_19.low = auVar3._0_8_;
        a_19.high = auVar3._8_2_;
        a_19._10_2_ = auVar3._10_2_;
        auVar3 = fVar16._0_12_;
        b_20._12_4_ = 0;
        b_20.low = auVar3._0_8_;
        b_20.high = auVar3._8_2_;
        b_20._10_2_ = auVar3._10_2_;
        fVar16 = floatx80_mul_m68k(a_19,b_20,status);
        auVar3 = fVar17._0_12_;
        a_20._12_4_ = 0;
        a_20.low = auVar3._0_8_;
        a_20.high = auVar3._8_2_;
        a_20._10_2_ = auVar3._10_2_;
        auVar3 = fVar15._0_12_;
        b_21._12_4_ = 0;
        b_21.low = auVar3._0_8_;
        b_21.high = auVar3._8_2_;
        b_21._10_2_ = auVar3._10_2_;
        fVar15 = floatx80_mul_m68k(a_20,b_21,status);
        fVar17 = float64_to_floatx80_m68k(0xbfd5555555555536,status);
        b_22._8_8_ = fVar17._8_8_ & 0xffffffff;
        auVar4 = fVar16._0_12_;
        a_21._12_4_ = 0;
        a_21.low = auVar4._0_8_;
        a_21.high = auVar4._8_2_;
        a_21._10_2_ = auVar4._10_2_;
        b_22.low = fVar17.low;
        fVar16 = floatx80_add_m68k(a_21,b_22,status);
        auVar4 = fVar13._0_12_;
        a_22._12_4_ = 0;
        a_22.low = auVar3._0_8_;
        a_22.high = auVar3._8_2_;
        a_22._10_2_ = auVar3._10_2_;
        b_23._12_4_ = 0;
        b_23.low = auVar4._0_8_;
        b_23.high = auVar4._8_2_;
        b_23._10_2_ = auVar4._10_2_;
        fVar13 = floatx80_mul_m68k(a_22,b_23,status);
        auVar3 = fVar16._0_12_;
        a_23._12_4_ = 0;
        a_23.low = auVar3._0_8_;
        a_23.high = auVar3._8_2_;
        a_23._10_2_ = auVar3._10_2_;
        auVar3 = fVar15._0_12_;
        b_24._12_4_ = 0;
        b_24.low = auVar3._0_8_;
        b_24.high = auVar3._8_2_;
        b_24._10_2_ = auVar3._10_2_;
        fVar15 = floatx80_add_m68k(a_23,b_24,status);
        b_25._8_8_ = fVar15._8_8_ & 0xffffffff;
        auVar3 = fVar13._0_12_;
        a_24._12_4_ = 0;
        a_24.low = auVar3._0_8_;
        a_24.high = auVar3._8_2_;
        a_24._10_2_ = auVar3._10_2_;
        b_25.low = fVar15.low;
        fVar13 = floatx80_mul_m68k(a_24,b_25,status);
        auVar3 = fVar13._0_12_;
        a_25._12_4_ = 0;
        a_25.low = auVar3._0_8_;
        a_25.high = auVar3._8_2_;
        a_25._10_2_ = auVar3._10_2_;
        b_26._12_4_ = 0;
        b_26.low = auVar4._0_8_;
        b_26.high = auVar4._8_2_;
        b_26._10_2_ = auVar4._10_2_;
        fVar13 = floatx80_add_m68k(a_25,b_26,status);
        uVar7 = fVar13.low;
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        uVar8 = fVar13._8_4_;
        uVar9 = 0xc90fdaa22168c235;
        uVar11 = (ulong)(uVar12 & 0xffff8000 | 0x3fff);
        goto LAB_006721cd;
      }
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      a_00._8_4_ = (uVar12 & 0xffff8000) + 0x3fff;
      a_00.low = 0xc90fdaa22168c235;
      a_00._12_4_ = 0;
      b._8_4_ = (uVar12 & 0xffff8000) + 1;
      b.low = 0x8000000000000000;
      b._12_4_ = 0;
      fVar13 = floatx80_sub_m68k(a_00,b,status);
      auVar3 = fVar13._0_12_;
    }
  }
  else {
    uVar11 = uVar9 & 0xf800000000000000 | 0x400000000000000;
    fVar16._12_4_ = 0;
    fVar16.low = auVar3._0_8_;
    fVar16.high = auVar3._8_2_;
    fVar16._10_2_ = auVar3._10_2_;
    b_00._8_4_ = uVar12;
    b_00.low = uVar11;
    b_00._12_4_ = 0;
    fVar13 = floatx80_mul_m68k(fVar16,b_00,status);
    fVar17._12_4_ = 0;
    fVar17.low = auVar3._0_8_;
    fVar17.high = auVar3._8_2_;
    fVar17._10_2_ = auVar3._10_2_;
    b_01._8_4_ = uVar12;
    b_01.low = uVar11;
    b_01._12_4_ = 0;
    fVar15 = floatx80_sub_m68k(fVar17,b_01,status);
    auVar3 = fVar13._0_12_;
    fVar18._12_4_ = 0;
    fVar18.low = auVar3._0_8_;
    fVar18.high = auVar3._8_2_;
    fVar18._10_2_ = auVar3._10_2_;
    b_02._8_8_ = 0x3fff;
    b_02.low = 0x8000000000000000;
    fVar13 = floatx80_add_m68k(fVar18,b_02,status);
    b_03._8_8_ = fVar13._8_8_ & 0xffffffff;
    auVar3 = fVar15._0_12_;
    a_01._12_4_ = 0;
    a_01.low = auVar3._0_8_;
    a_01.high = auVar3._8_2_;
    a_01._10_2_ = auVar3._10_2_;
    b_03.low = fVar13.low;
    fVar13 = floatx80_div_m68k(a_01,b_03,status);
    uVar12 = uVar6 >> 0xb & 0xf | (int)(uVar10 + 0xc0050000) >> 0xc;
    uVar9 = atan_tbl[(int)uVar12].low;
    uVar11 = (ulong)(a.high & 0x8000 | atan_tbl[(int)uVar12].high);
    auVar3 = fVar13._0_12_;
    a_02._12_4_ = 0;
    a_02.low = auVar3._0_8_;
    a_02.high = auVar3._8_2_;
    a_02._10_2_ = auVar3._10_2_;
    b_04._12_4_ = 0;
    b_04.low = auVar3._0_8_;
    b_04.high = auVar3._8_2_;
    b_04._10_2_ = auVar3._10_2_;
    fVar13 = floatx80_mul_m68k(a_02,b_04,status);
    fVar15 = float64_to_floatx80_m68k(0xbff6687e314987d8,status);
    auVar4 = fVar15._0_12_;
    a_03._12_4_ = 0;
    a_03.low = auVar4._0_8_;
    a_03.high = auVar4._8_2_;
    a_03._10_2_ = auVar4._10_2_;
    auVar4 = fVar13._0_12_;
    b_05._12_4_ = 0;
    b_05.low = auVar4._0_8_;
    b_05.high = auVar4._8_2_;
    b_05._10_2_ = auVar4._10_2_;
    fVar13 = floatx80_add_m68k(a_03,b_05,status);
    auVar5 = fVar13._0_12_;
    a_04._12_4_ = 0;
    a_04.low = auVar5._0_8_;
    a_04.high = auVar5._8_2_;
    a_04._10_2_ = auVar5._10_2_;
    b_06._12_4_ = 0;
    b_06.low = auVar4._0_8_;
    b_06.high = auVar4._8_2_;
    b_06._10_2_ = auVar4._10_2_;
    fVar13 = floatx80_mul_m68k(a_04,b_06,status);
    a_05._12_4_ = 0;
    a_05.low = auVar4._0_8_;
    a_05.high = auVar4._8_2_;
    a_05._10_2_ = auVar4._10_2_;
    b_07._12_4_ = 0;
    b_07.low = auVar3._0_8_;
    b_07.high = auVar3._8_2_;
    b_07._10_2_ = auVar3._10_2_;
    fVar15 = floatx80_mul_m68k(a_05,b_07,status);
    fVar16 = float64_to_floatx80_m68k(0x4002ac6934a26db3,status);
    b_08._8_8_ = fVar16._8_8_ & 0xffffffff;
    auVar4 = fVar13._0_12_;
    a_06._12_4_ = 0;
    a_06.low = auVar4._0_8_;
    a_06.high = auVar4._8_2_;
    a_06._10_2_ = auVar4._10_2_;
    b_08.low = fVar16.low;
    fVar13 = floatx80_add_m68k(a_06,b_08,status);
    fVar16 = float64_to_floatx80_m68k(0xbfc2476f4e1da28e,status);
    b_09._8_8_ = fVar16._8_8_ & 0xffffffff;
    auVar4 = fVar15._0_12_;
    a_07._12_4_ = 0;
    a_07.low = auVar4._0_8_;
    a_07.high = auVar4._8_2_;
    a_07._10_2_ = auVar4._10_2_;
    b_09.low = fVar16.low;
    fVar15 = floatx80_mul_m68k(a_07,b_09,status);
    auVar4 = fVar15._0_12_;
    a_08._12_4_ = 0;
    a_08.low = auVar4._0_8_;
    a_08.high = auVar4._8_2_;
    a_08._10_2_ = auVar4._10_2_;
    auVar4 = fVar13._0_12_;
    b_10._12_4_ = 0;
    b_10.low = auVar4._0_8_;
    b_10.high = auVar4._8_2_;
    b_10._10_2_ = auVar4._10_2_;
    fVar13 = floatx80_mul_m68k(a_08,b_10,status);
    b_11._8_8_ = fVar13._8_8_ & 0xffffffff;
    a_09._12_4_ = 0;
    a_09.low = auVar3._0_8_;
    a_09.high = auVar3._8_2_;
    a_09._10_2_ = auVar3._10_2_;
    b_11.low = fVar13.low;
    fVar13 = floatx80_add_m68k(a_09,b_11,status);
    uVar7 = fVar13.low;
    status->float_rounding_mode = cVar1;
    status->floatx80_rounding_precision = cVar2;
    uVar8 = fVar13._8_4_;
LAB_006721cd:
    a_10._8_4_ = uVar8;
    a_10.low = uVar7;
    a_10._12_4_ = 0;
    b_12._8_8_ = uVar11;
    b_12.low = uVar9;
    fVar13 = floatx80_add_m68k(a_10,b_12,status);
    auVar3 = fVar13._0_12_;
  }
  uVar9 = auVar3._0_8_;
  float_raise_m68k(' ',status);
  uVar11 = (ulong)auVar3._8_4_;
LAB_006721ea:
  fVar14._8_8_ = uVar11;
  fVar14.low = uVar9;
  return fVar14;
}

Assistant:

floatx80 floatx80_atan(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, tbl_index;
    floatx80 fp0, fp1, fp2, fp3, xsave;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        a = packFloatx80(aSign, piby2_exp, pi_sig);
        float_raise(float_flag_inexact, status);
        return floatx80_move(a, status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    compact = floatx80_make_compact(aExp, aSig);

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    if (compact < 0x3FFB8000 || compact > 0x4002FFFF) {
        /* |X| >= 16 or |X| < 1/16 */
        if (compact > 0x3FFF8000) { /* |X| >= 16 */
            if (compact > 0x40638000) { /* |X| > 2^(100) */
                fp0 = packFloatx80(aSign, piby2_exp, pi_sig);
                fp1 = packFloatx80(aSign, 0x0001, one_sig);

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_sub(fp0, fp1, status);

                float_raise(float_flag_inexact, status);

                return a;
            } else {
                fp0 = a;
                fp1 = packFloatx80(1, one_exp, one_sig); /* -1 */
                fp1 = floatx80_div(fp1, fp0, status); /* X' = -1/X */
                xsave = fp1;
                fp0 = floatx80_mul(fp1, fp1, status); /* Y = X'*X' */
                fp1 = floatx80_mul(fp0, fp0, status); /* Z = Y*Y */
                fp3 = float64_to_floatx80(make_float64(0xBFB70BF398539E6A),
                                          status); /* C5 */
                fp2 = float64_to_floatx80(make_float64(0x3FBC7187962D1D7D),
                                          status); /* C4 */
                fp3 = floatx80_mul(fp3, fp1, status); /* Z*C5 */
                fp2 = floatx80_mul(fp2, fp1, status); /* Z*C4 */
                fp3 = floatx80_add(fp3, float64_to_floatx80(
                                   make_float64(0xBFC24924827107B8), status),
                                   status); /* C3+Z*C5 */
                fp2 = floatx80_add(fp2, float64_to_floatx80(
                                   make_float64(0x3FC999999996263E), status),
                                   status); /* C2+Z*C4 */
                fp1 = floatx80_mul(fp1, fp3, status); /* Z*(C3+Z*C5) */
                fp2 = floatx80_mul(fp2, fp0, status); /* Y*(C2+Z*C4) */
                fp1 = floatx80_add(fp1, float64_to_floatx80(
                                   make_float64(0xBFD5555555555536), status),
                                   status); /* C1+Z*(C3+Z*C5) */
                fp0 = floatx80_mul(fp0, xsave, status); /* X'*Y */
                /* [Y*(C2+Z*C4)]+[C1+Z*(C3+Z*C5)] */
                fp1 = floatx80_add(fp1, fp2, status);
                /* X'*Y*([B1+Z*(B3+Z*B5)]+[Y*(B2+Z*(B4+Z*B6))]) ?? */
                fp0 = floatx80_mul(fp0, fp1, status);
                fp0 = floatx80_add(fp0, xsave, status);
                fp1 = packFloatx80(aSign, piby2_exp, pi_sig);

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp0, fp1, status);

                float_raise(float_flag_inexact, status);

                return a;
            }
        } else { /* |X| < 1/16 */
            if (compact < 0x3FD78000) { /* |X| < 2^(-40) */
                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_move(a, status);

                float_raise(float_flag_inexact, status);

                return a;
            } else {
                fp0 = a;
                xsave = a;
                fp0 = floatx80_mul(fp0, fp0, status); /* Y = X*X */
                fp1 = floatx80_mul(fp0, fp0, status); /* Z = Y*Y */
                fp2 = float64_to_floatx80(make_float64(0x3FB344447F876989),
                                          status); /* B6 */
                fp3 = float64_to_floatx80(make_float64(0xBFB744EE7FAF45DB),
                                          status); /* B5 */
                fp2 = floatx80_mul(fp2, fp1, status); /* Z*B6 */
                fp3 = floatx80_mul(fp3, fp1, status); /* Z*B5 */
                fp2 = floatx80_add(fp2, float64_to_floatx80(
                                   make_float64(0x3FBC71C646940220), status),
                                   status); /* B4+Z*B6 */
                fp3 = floatx80_add(fp3, float64_to_floatx80(
                                   make_float64(0xBFC24924921872F9),
                                   status), status); /* B3+Z*B5 */
                fp2 = floatx80_mul(fp2, fp1, status); /* Z*(B4+Z*B6) */
                fp1 = floatx80_mul(fp1, fp3, status); /* Z*(B3+Z*B5) */
                fp2 = floatx80_add(fp2, float64_to_floatx80(
                                   make_float64(0x3FC9999999998FA9), status),
                                   status); /* B2+Z*(B4+Z*B6) */
                fp1 = floatx80_add(fp1, float64_to_floatx80(
                                   make_float64(0xBFD5555555555555), status),
                                   status); /* B1+Z*(B3+Z*B5) */
                fp2 = floatx80_mul(fp2, fp0, status); /* Y*(B2+Z*(B4+Z*B6)) */
                fp0 = floatx80_mul(fp0, xsave, status); /* X*Y */
                /* [B1+Z*(B3+Z*B5)]+[Y*(B2+Z*(B4+Z*B6))] */
                fp1 = floatx80_add(fp1, fp2, status);
                /* X*Y*([B1+Z*(B3+Z*B5)]+[Y*(B2+Z*(B4+Z*B6))]) */
                fp0 = floatx80_mul(fp0, fp1, status);

                status->float_rounding_mode = user_rnd_mode;
                status->floatx80_rounding_precision = user_rnd_prec;

                a = floatx80_add(fp0, xsave, status);

                float_raise(float_flag_inexact, status);

                return a;
            }
        }
    } else {
        aSig &= UINT64_C(0xF800000000000000);
        aSig |= UINT64_C(0x0400000000000000);
        xsave = packFloatx80(aSign, aExp, aSig); /* F */
        fp0 = a;
        fp1 = a; /* X */
        fp2 = packFloatx80(0, one_exp, one_sig); /* 1 */
        fp1 = floatx80_mul(fp1, xsave, status); /* X*F */
        fp0 = floatx80_sub(fp0, xsave, status); /* X-F */
        fp1 = floatx80_add(fp1, fp2, status); /* 1 + X*F */
        fp0 = floatx80_div(fp0, fp1, status); /* U = (X-F)/(1+X*F) */

        tbl_index = compact;

        tbl_index &= 0x7FFF0000;
        tbl_index -= 0x3FFB0000;
        tbl_index >>= 1;
        tbl_index += compact & 0x00007800;
        tbl_index >>= 11;

        fp3 = atan_tbl[tbl_index];

        fp3.high |= aSign ? 0x8000 : 0; /* ATAN(F) */

        fp1 = floatx80_mul(fp0, fp0, status); /* V = U*U */
        fp2 = float64_to_floatx80(make_float64(0xBFF6687E314987D8),
                                  status); /* A3 */
        fp2 = floatx80_add(fp2, fp1, status); /* A3+V */
        fp2 = floatx80_mul(fp2, fp1, status); /* V*(A3+V) */
        fp1 = floatx80_mul(fp1, fp0, status); /* U*V */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x4002AC6934A26DB3), status),
                           status); /* A2+V*(A3+V) */
        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0xBFC2476F4E1DA28E), status),
                           status); /* A1+U*V */
        fp1 = floatx80_mul(fp1, fp2, status); /* A1*U*V*(A2+V*(A3+V)) */
        fp0 = floatx80_add(fp0, fp1, status); /* ATAN(U) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, fp3, status); /* ATAN(X) */

        float_raise(float_flag_inexact, status);

        return a;
    }
}